

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets_tests.cpp
# Opt level: O0

void __thiscall timeoffsets_tests::timeoffsets::test_method(timeoffsets *this)

{
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> __l;
  bool bVar1;
  seconds sVar2;
  long in_FS_OFFSET;
  TimeOffsets offsets;
  Warnings warnings;
  TimeOffsets *in_stack_fffffffffffff968;
  undefined7 in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff977;
  undefined7 in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff97f;
  allocator_type *in_stack_fffffffffffff980;
  undefined7 in_stack_fffffffffffff988;
  undefined1 in_stack_fffffffffffff98f;
  seconds in_stack_fffffffffffff990;
  seconds in_stack_fffffffffffff998;
  const_string *in_stack_fffffffffffff9a0;
  const_string *file;
  Warnings *in_stack_fffffffffffff9a8;
  unit_test_log_t *this_00;
  TimeOffsets *in_stack_fffffffffffff9b0;
  undefined7 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9bf;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  const_string local_4e0 [2];
  lazy_ostream local_4c0 [2];
  rep local_4a0;
  rep local_498;
  assertion_result local_490 [2];
  undefined1 local_451 [33];
  const_string local_430 [2];
  lazy_ostream local_410 [2];
  rep local_3f0;
  rep local_3e8;
  assertion_result local_3e0 [2];
  rep local_3a0;
  const_string local_380 [2];
  lazy_ostream local_360 [2];
  rep local_340;
  rep local_338;
  assertion_result local_330 [2];
  rep local_2f0;
  const_string local_2d0 [2];
  lazy_ostream local_2b0 [2];
  rep local_290;
  rep local_288;
  rep local_280;
  assertion_result local_278 [2];
  rep local_240;
  const_string local_238 [2];
  lazy_ostream local_218 [2];
  rep local_1f8;
  rep local_1f0;
  assertion_result local_1e8 [3];
  const_string local_190 [2];
  lazy_ostream local_170 [2];
  rep local_150;
  rep local_148;
  assertion_result local_140 [7];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ::node::Warnings::Warnings(in_stack_fffffffffffff9a8);
  TimeOffsets::TimeOffsets
            ((TimeOffsets *)in_stack_fffffffffffff998.__r,(Warnings *)in_stack_fffffffffffff990.__r)
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff998.__r,(const_string *)in_stack_fffffffffffff990.__r);
    local_148 = (rep)TimeOffsets::Median(in_stack_fffffffffffff9b0);
    local_150 = (rep)s<(char)48>();
    std::chrono::operator==
              ((duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (bool)in_stack_fffffffffffff977);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    in_stack_fffffffffffff968 = (TimeOffsets *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_140,local_170,local_190,0x1e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff968);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff968);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_78 = 0xfffffffffffffffe;
  uStack_70 = 0xfffffffffffffffd;
  local_88 = 0;
  uStack_80 = 0xffffffffffffffff;
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_fffffffffffff968);
  __l._M_len._0_7_ = in_stack_fffffffffffff9b8;
  __l._M_array = (iterator)in_stack_fffffffffffff9b0;
  __l._M_len._7_1_ = in_stack_fffffffffffff9bf;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)in_stack_fffffffffffff9a8,__l,(allocator_type *)in_stack_fffffffffffff9a0);
  AddMulti((TimeOffsets *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
           (vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978));
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_fffffffffffff968);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff998.__r,(const_string *)in_stack_fffffffffffff990.__r);
    local_1f0 = (rep)TimeOffsets::Median(in_stack_fffffffffffff9b0);
    local_1f8 = (rep)s<(char)48>();
    std::chrono::operator==
              ((duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (bool)in_stack_fffffffffffff977);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    in_stack_fffffffffffff968 = (TimeOffsets *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e8,local_218,local_238,0x22,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff968);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff968);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_240 = (rep)s<(char)52>();
  std::chrono::duration<long,_std::ratio<1L,_1L>_>::operator-
            ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff968);
  sVar2.__r._7_1_ = in_stack_fffffffffffff9ff;
  sVar2.__r._0_7_ = in_stack_fffffffffffff9f8;
  TimeOffsets::Add((TimeOffsets *)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8),
                   sVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff998.__r,(const_string *)in_stack_fffffffffffff990.__r);
    local_280 = (rep)TimeOffsets::Median(in_stack_fffffffffffff9b0);
    local_290 = (rep)s<(char)50>();
    local_288 = (rep)std::chrono::duration<long,_std::ratio<1L,_1L>_>::operator-
                               ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffff968);
    std::chrono::operator==
              ((duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (bool)in_stack_fffffffffffff977);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    in_stack_fffffffffffff968 = (TimeOffsets *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_278,local_2b0,local_2d0,0x26,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff968);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff968);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_2f0 = (rep)s<(char)53>();
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_fffffffffffff968);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)in_stack_fffffffffffff998.__r,in_stack_fffffffffffff990.__r,
           (value_type *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
           in_stack_fffffffffffff980);
  AddMulti((TimeOffsets *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
           (vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978));
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_fffffffffffff968);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff998.__r,(const_string *)in_stack_fffffffffffff990.__r);
    local_338 = (rep)TimeOffsets::Median(in_stack_fffffffffffff9b0);
    local_340 = (rep)s<(char)48>();
    std::chrono::operator==
              ((duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (bool)in_stack_fffffffffffff977);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    in_stack_fffffffffffff968 = (TimeOffsets *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_330,local_360,local_380,0x2a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff968);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff968);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_3a0 = (rep)s<(char)49,(char)48>();
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_fffffffffffff968);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)in_stack_fffffffffffff998.__r,in_stack_fffffffffffff990.__r,
           (value_type *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
           in_stack_fffffffffffff980);
  AddMulti((TimeOffsets *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
           (vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978));
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_fffffffffffff968);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               in_stack_fffffffffffff998.__r,(const_string *)in_stack_fffffffffffff990.__r);
    local_3e8 = (rep)TimeOffsets::Median(in_stack_fffffffffffff9b0);
    local_3f0 = (rep)s<(char)49,(char)48>();
    std::chrono::operator==
              ((duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (bool)in_stack_fffffffffffff977);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    in_stack_fffffffffffff968 = (TimeOffsets *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3e0,local_410,local_430,0x2e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff968);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff968);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  sVar2 = s<(char)49,(char)53>();
  this_00 = (unit_test_log_t *)local_451;
  local_451._1_8_ = sVar2;
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_fffffffffffff968);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)in_stack_fffffffffffff998.__r,in_stack_fffffffffffff990.__r,
           (value_type *)CONCAT17(in_stack_fffffffffffff98f,in_stack_fffffffffffff988),
           in_stack_fffffffffffff980);
  AddMulti((TimeOffsets *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
           (vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~vector((vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978));
  std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::~allocator
            ((allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
             in_stack_fffffffffffff968);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,in_stack_fffffffffffff998.__r,
               (const_string *)in_stack_fffffffffffff990.__r);
    in_stack_fffffffffffff998 = TimeOffsets::Median(sVar2.__r);
    local_498 = in_stack_fffffffffffff998.__r;
    in_stack_fffffffffffff990 = s<(char)49,(char)53>();
    local_4a0 = in_stack_fffffffffffff990.__r;
    std::chrono::operator==
              ((duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (bool)in_stack_fffffffffffff977);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (basic_cstring<const_char> *)in_stack_fffffffffffff968);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
               (pointer)CONCAT17(in_stack_fffffffffffff977,in_stack_fffffffffffff970),
               (unsigned_long)in_stack_fffffffffffff968);
    in_stack_fffffffffffff968 = (TimeOffsets *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_490,local_4c0,local_4e0,0x32,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff968);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff968);
    in_stack_fffffffffffff97f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff97f);
  TimeOffsets::~TimeOffsets(in_stack_fffffffffffff968);
  ::node::Warnings::~Warnings((Warnings *)in_stack_fffffffffffff968);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(timeoffsets)
{
    node::Warnings warnings{};
    TimeOffsets offsets{warnings};
    BOOST_CHECK(offsets.Median() == 0s);

    AddMulti(offsets, {{0s, -1s, -2s, -3s}});
    // median should be zero for < 5 offsets
    BOOST_CHECK(offsets.Median() == 0s);

    offsets.Add(-4s);
    // we now have 5 offsets: [-4, -3, -2, -1, 0]
    BOOST_CHECK(offsets.Median() == -2s);

    AddMulti(offsets, {4, 5s});
    // we now have 9 offsets: [-4, -3, -2, -1, 0, 5, 5, 5, 5]
    BOOST_CHECK(offsets.Median() == 0s);

    AddMulti(offsets, {41, 10s});
    // the TimeOffsets is now at capacity with 50 offsets, oldest offsets is discarded for any additional offset
    BOOST_CHECK(offsets.Median() == 10s);

    AddMulti(offsets, {25, 15s});
    // we now have 25 offsets of 10s followed by 25 offsets of 15s
    BOOST_CHECK(offsets.Median() == 15s);
}